

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O2

void libtorrent::merkle_validate_copy
               (span<const_libtorrent::digest32<256L>_> src,span<libtorrent::digest32<256L>_> dst,
               sha256_hash *root,bitfield *verified_leafs)

{
  sha256_hash *right;
  undefined8 *puVar1;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  digest32<256L> *pdVar9;
  long lVar10;
  sha256_hash *left;
  int iVar11;
  digest32<256L> *this;
  ulong uVar12;
  digest32<256L> *this_00;
  int iVar13;
  
  this = src.m_ptr;
  pdVar9 = dst.m_ptr;
  if (src.m_len != 0) {
    bVar6 = digest32<256L>::operator!=(this,root);
    if (!bVar6) {
      uVar3 = *(undefined8 *)(this->m_number)._M_elems;
      uVar4 = *(undefined8 *)((this->m_number)._M_elems + 2);
      uVar5 = *(undefined8 *)((this->m_number)._M_elems + 6);
      *(undefined8 *)((pdVar9->m_number)._M_elems + 4) =
           *(undefined8 *)((this->m_number)._M_elems + 4);
      *(undefined8 *)((pdVar9->m_number)._M_elems + 6) = uVar5;
      *(undefined8 *)(pdVar9->m_number)._M_elems = uVar3;
      *(undefined8 *)((pdVar9->m_number)._M_elems + 2) = uVar4;
      uVar7 = (int)((dst.m_len + 1) / -2) + (int)src.m_len;
      lVar10 = 0;
      uVar12 = 0;
      if (0 < (int)uVar7) {
        uVar12 = (ulong)uVar7;
      }
      iVar13 = 1;
      this_00 = pdVar9;
      for (; uVar12 * 0x40 != lVar10; lVar10 = lVar10 + 0x40) {
        bVar6 = digest32<256L>::is_all_zeros(this_00);
        if (!bVar6) {
          left = (sha256_hash *)((long)this[1].m_number._M_elems + lVar10);
          right = (sha256_hash *)((long)this[2].m_number._M_elems + lVar10);
          bVar6 = merkle_validate_node(left,right,this_00);
          if (bVar6) {
            uVar3 = *(undefined8 *)(left->m_number)._M_elems;
            uVar4 = *(undefined8 *)((long)this[1].m_number._M_elems + lVar10 + 8);
            uVar5 = *(undefined8 *)((long)this[1].m_number._M_elems + lVar10 + 0x18);
            puVar1 = (undefined8 *)((long)pdVar9[1].m_number._M_elems + lVar10 + 0x10);
            *puVar1 = *(undefined8 *)((long)this[1].m_number._M_elems + lVar10 + 0x10);
            puVar1[1] = uVar5;
            puVar1 = (undefined8 *)((long)pdVar9[1].m_number._M_elems + lVar10);
            *puVar1 = uVar3;
            puVar1[1] = uVar4;
            uVar3 = *(undefined8 *)((right->m_number)._M_elems + 2);
            uVar4 = *(undefined8 *)((right->m_number)._M_elems + 4);
            uVar5 = *(undefined8 *)((right->m_number)._M_elems + 6);
            puVar1 = (undefined8 *)((long)pdVar9[2].m_number._M_elems + lVar10);
            *puVar1 = *(undefined8 *)(right->m_number)._M_elems;
            puVar1[1] = uVar3;
            puVar1 = (undefined8 *)((long)pdVar9[2].m_number._M_elems + lVar10 + 0x10);
            *puVar1 = uVar4;
            puVar1[1] = uVar5;
            if ((int)uVar7 <= iVar13) {
              _Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
                   (verified_leafs->m_buf).
                   super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                   super__Head_base<0UL,_unsigned_int_*,_false>;
              if (_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
                iVar8 = 0;
              }
              else {
                iVar8 = *(int *)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
              }
              iVar11 = -uVar7 + iVar13;
              if (iVar11 < iVar8) {
                bitfield::set_bit(verified_leafs,iVar11);
                _Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
                     (verified_leafs->m_buf).
                     super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                     super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                     super__Head_base<0UL,_unsigned_int_*,_false>;
                if (_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0)
                {
                  iVar8 = 0;
                }
                else {
                  iVar8 = *(int *)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
                }
                iVar11 = -uVar7 + iVar13 + 1;
                if (iVar11 < iVar8) {
                  bitfield::set_bit(verified_leafs,iVar11);
                }
              }
            }
          }
        }
        iVar13 = iVar13 + 2;
        this_00 = this_00 + 1;
      }
    }
  }
  return;
}

Assistant:

void merkle_validate_copy(span<sha256_hash const> const src
		, span<sha256_hash> const dst, sha256_hash const& root
		, bitfield& verified_leafs)
	{
		TORRENT_ASSERT(src.size() == dst.size());
		int const num_leafs = int((dst.size() + 1) / 2);
		if (src.empty()) return;
		if (src[0] != root) return;
		dst[0] = src[0];
		int const leaf_layer_start = int(src.size() - num_leafs);
		for (int i = 0; i < leaf_layer_start; ++i)
		{
			if (dst[i].is_all_zeros()) continue;
			int const left_child = merkle_get_first_child(i);
			int const right_child = left_child + 1;
			if (merkle_validate_node(src[left_child], src[right_child], dst[i]))
			{
				dst[left_child] = src[left_child];
				dst[right_child] = src[right_child];
				int const block_idx = left_child - leaf_layer_start;
				if (left_child >= leaf_layer_start
					&& block_idx < verified_leafs.size())
				{
					verified_leafs.set_bit(block_idx);
					// the right child may be the first block of padding hash,
					// in which case it's not part of the verified bitfield
					if (block_idx + 1 < verified_leafs.size())
						verified_leafs.set_bit(block_idx + 1);
				}
			}
		}
	}